

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

bool __thiscall
testing::internal::OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)>::Matches
          (OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)> *this,ArgumentTuple *args)

{
  bool bVar1;
  DummyMatchResultListener dummy;
  MatchResultListener local_20;
  
  bVar1 = TuplePrefix<9ul>::
          Matches<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int,int,int,int,int,int,int,int>>
                    ((tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                      *)(this + 0x10),args);
  if (bVar1) {
    local_20.stream_ = (ostream *)0x0;
    local_20._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_001912a8;
    bVar1 = MatcherBase<const_std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int>_&>::
            MatchAndExplain((MatcherBase<const_std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int>_&>
                             *)(this + 0xe8),args,&local_20);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }